

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.cpp
# Opt level: O2

ExecutionResult * __thiscall
SchemeCompoundProcedure::_run
          (ExecutionResult *__return_storage_ptr__,SchemeCompoundProcedure *this,
          list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>
          *val_list)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *__r;
  ulong uVar1;
  ulong uVar2;
  _List_node_base *p_Var3;
  size_t i;
  ulong uVar4;
  const_reverse_iterator rlit;
  _List_node_base *p_Var5;
  ExecutionResult *res;
  Context local_context;
  shared_ptr<SchemeObject> rem;
  Context local_90;
  ExecutionResult local_70;
  ExecutionResult local_50;
  
  Context::Context(&local_90,&this->context);
  Context::new_frame(&local_90);
  uVar4 = 0;
  p_Var3 = (_List_node_base *)&this->params;
  p_Var5 = (_List_node_base *)val_list;
  while( true ) {
    p_Var3 = (((_List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&p_Var3->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    p_Var5 = (((_List_base<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>
                *)&p_Var5->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    uVar1 = (val_list->
            super__List_base<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>
            )._M_impl._M_node._M_size;
    uVar2 = ((this->super_SchemeProcedure).arity.second >> 0x3f) +
            (this->params).
            super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl._M_node._M_size;
    if (uVar1 <= uVar2) {
      uVar2 = uVar1;
    }
    if (uVar2 <= uVar4) break;
    Context::set(&local_90,(string *)(p_Var3 + 1),(shared_ptr<SchemeObject> *)(p_Var5 + 1));
    uVar4 = uVar4 + 1;
  }
  if (p_Var5 == (_List_node_base *)val_list) {
    for (; p_Var3 != (_List_node_base *)&this->params; p_Var3 = p_Var3->_M_next) {
      Context::set(&local_90,(string *)(p_Var3 + 1),&scheme_empty);
    }
    if ((this->super_SchemeProcedure).arity.second < 0) {
      Context::set(&local_90,
                   (string *)
                   ((this->params).
                    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl._M_node.super__List_node_base._M_prev + 1),&scheme_nil);
    }
  }
  else {
    std::__shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2> *)&local_70,
               &scheme_nil.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>);
    __r = &local_50.value.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    for (; (_List_node_base *)val_list != p_Var5;
        val_list = (list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>
                    *)((_List_node_base *)val_list)->_M_prev) {
      std::
      make_shared<SchemePair,std::shared_ptr<SchemeObject>const&,std::shared_ptr<SchemeObject>&>
                ((shared_ptr<SchemeObject> *)__r,
                 (shared_ptr<SchemeObject> *)(((_List_node_base *)val_list)->_M_prev + 1));
      std::__shared_ptr<SchemeObject,(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<SchemeObject,(__gnu_cxx::_Lock_policy)2> *)&local_70,
                 (__shared_ptr<SchemePair,_(__gnu_cxx::_Lock_policy)2> *)__r);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_50.tail_context);
    }
    Context::set(&local_90,
                 (string *)
                 ((this->params).
                  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl._M_node.super__List_node_base._M_prev + 1),
                 (shared_ptr<SchemeObject> *)&local_70);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_70.value);
  }
  __return_storage_ptr__->type = VALUE;
  (__return_storage_ptr__->tail_context)._M_t.
  super___uniq_ptr_impl<TailContext,_std::default_delete<TailContext>_>._M_t.
  super__Tuple_impl<0UL,_TailContext_*,_std::default_delete<TailContext>_>.
  super__Head_base<0UL,_TailContext_*,_false>._M_head_impl = (TailContext *)0x0;
  (__return_storage_ptr__->value).super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (__return_storage_ptr__->value).super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var3 = (_List_node_base *)&this->body;
  while (p_Var3 = (((_List_base<ASTNode,_std::allocator<ASTNode>_> *)&p_Var3->_M_next)->_M_impl).
                  _M_node.super__List_node_base._M_next, p_Var3 != (_List_node_base *)&this->body) {
    ExecutionResult::force_value(&local_50);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_50.value);
    ASTNode::evaluate(&local_70,(ASTNode *)(p_Var3 + 1),&local_90);
    ExecutionResult::operator=(__return_storage_ptr__,&local_70);
    ExecutionResult::~ExecutionResult(&local_70);
  }
  std::__cxx11::
  _List_base<std::shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<SchemeObject>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<SchemeObject>_>_>_>_>,_std::allocator<std::shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<SchemeObject>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<SchemeObject>_>_>_>_>_>_>
  ::_M_clear((_List_base<std::shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<SchemeObject>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<SchemeObject>_>_>_>_>,_std::allocator<std::shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<SchemeObject>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<SchemeObject>_>_>_>_>_>_>
              *)&local_90);
  return __return_storage_ptr__;
}

Assistant:

ExecutionResult SchemeCompoundProcedure::_run(const std::list<std::shared_ptr<SchemeObject>> &val_list) const
{
    Context local_context = context;
    local_context.new_frame();
    auto pit = params.begin();
    auto lit = val_list.begin();

    for(size_t i=0; i < std::min(val_list.size(), params.size() - (arity.second < 0)); ++lit, ++pit, ++i)
    {
        local_context.set(*pit, *lit);
    }
    if(lit == val_list.end())
    {
        for(;pit!=params.end(); ++pit)
        {
            local_context.set(*pit, scheme_empty);
        }
        if(arity.second < 0)
            local_context.set(params.back(), scheme_nil);
    }
    else
    {
        auto rem = scheme_nil;
        for(auto rlit = val_list.rbegin(); rlit.base() != lit; ++rlit)
            rem = std::make_shared<SchemePair>(*rlit, rem);
        local_context.set(params.back(), rem);
    }

    ExecutionResult res;
    for(auto i = body.begin(); i != body.end(); ++i)
    {
        res.force_value();
        res = i->evaluate(local_context);
    }
    return res;
}